

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType2::operator==(GridDataType2 *this,GridDataType2 *Value)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  KBOOL KVar5;
  float *pfVar6;
  float *pfVar7;
  
  KVar5 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if ((!KVar5) &&
     (*(short *)&(this->super_GridData).field_0xc == *(short *)&(Value->super_GridData).field_0xc))
  {
    pfVar3 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar7 = (Value->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pfVar4 - (long)pfVar3 ==
        (long)(Value->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar7) {
      if (pfVar3 == pfVar4) {
        return true;
      }
      while( true ) {
        pfVar6 = pfVar3 + 1;
        fVar1 = *pfVar3;
        fVar2 = *pfVar7;
        KVar5 = (KBOOL)(-(fVar1 == fVar2) & 1);
        if (fVar1 != fVar2) {
          return KVar5;
        }
        if (NAN(fVar1) || NAN(fVar2)) break;
        pfVar7 = pfVar7 + 1;
        pfVar3 = pfVar6;
        if (pfVar6 == pfVar4) {
          return KVar5;
        }
      }
      return KVar5;
    }
  }
  return false;
}

Assistant:

KBOOL GridDataType2::operator == ( const GridDataType2 & Value ) const
{
    if( GridData::operator != ( Value ) )           return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues ) return false;
    if( m_vf32Values     != Value.m_vf32Values )    return false;
    return true;
}